

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O1

ClauseIterator __thiscall
Inferences::FunctionDefinitionRewriting::generateClauses
          (FunctionDefinitionRewriting *this,Clause *premise)

{
  Inference *pIVar1;
  int iVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Clause *pCVar5;
  byte bVar6;
  FunctionDefinitionRewriting *pFVar7;
  undefined8 uVar8;
  bool bVar9;
  _func_int **pp_Var10;
  _func_int *in_RDX;
  byte bVar11;
  byte bVar12;
  Value unaff_RBX;
  byte bVar13;
  uint uVar14;
  Value VVar15;
  byte bVar16;
  byte bVar17;
  Value unaff_R15;
  undefined1 local_210 [8];
  undefined1 auStack_208 [12];
  uint uStack_1fc;
  undefined1 auStack_1f8 [8];
  Value local_1f0;
  Value VStack_1e8;
  Value VStack_1e0;
  undefined8 local_1d8;
  Value VStack_1d0;
  byte local_1c8;
  Value local_1c0;
  undefined1 local_1b8;
  Value local_1a8;
  Clause *local_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  undefined4 uStack_18c;
  OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> local_188;
  byte local_178;
  Value local_170;
  byte local_168;
  Value local_160;
  FunctionDefinitionRewriting *local_158;
  Value local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
  MStack_140;
  undefined1 auStack_120 [28];
  uint uStack_104;
  undefined8 uStack_100;
  OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> local_f8;
  Clause *local_e0;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  undefined4 uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  undefined4 uStack_bc;
  byte local_b8;
  Value local_b0;
  byte local_a8;
  Value local_a0;
  Clause *local_88;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  undefined4 uStack_74;
  uint local_70;
  uint uStack_6c;
  uint uStack_68;
  undefined4 uStack_64;
  byte local_60;
  Value local_58;
  byte local_50;
  Value local_48;
  undefined1 local_40;
  
  uVar14 = *(uint *)(in_RDX + 0x38) & 0xfffff;
  stack0xfffffffffffffe00 = (Clause *)0x0;
  auStack_1f8 = (undefined1  [8])
                (CONCAT44(auStack_1f8._4_4_,*(uint *)(in_RDX + 0x38)) & 0xffffffff000fffff);
  auStack_208._0_8_ = in_RDX;
  if (uVar14 == 0) {
    local_1f0 = (Value)0x0;
    VStack_1e8 = (Value)0x0;
  }
  else {
    ::Lib::
    MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
    ::next((MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
            *)&local_150.init);
    unaff_RBX = local_150;
    if (local_150 != (Value)0x0) {
      *(int *)((long)local_150 + 8) = *(int *)((long)local_150 + 8) + 1;
    }
    local_1f0._0_1_ = 1;
    if (local_150 == (Value)0x0) {
      VStack_1e8 = local_150;
    }
    else {
      iVar2 = *(int *)((long)local_150 + 8);
      *(int *)((long)local_150 + 8) = iVar2 + 1;
      VStack_1e8 = local_150;
      *(int *)((long)local_150 + 8) = iVar2 + 2;
      pIVar1 = (Inference *)((long)local_150 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)local_150 + 8))(local_150);
      }
    }
  }
  if (uVar14 != 0) {
    if (unaff_RBX != (Value)0x0) {
      pIVar1 = (Inference *)((long)unaff_RBX + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)unaff_RBX + 8))(unaff_RBX);
      }
    }
    if (local_150 != (Value)0x0) {
      pIVar1 = (Inference *)((long)local_150 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)local_150 + 8))();
      }
    }
  }
  uVar3 = local_1f0._0_1_;
  if (((bool)local_1f0._0_1_ == true) && (unaff_R15 = VStack_1e8, VStack_1e8 != (Value)0x0)) {
    *(int *)((long)VStack_1e8 + 8) = *(int *)((long)VStack_1e8 + 8) + 1;
  }
  MStack_140._inner._func.a._0_4_ = auStack_208._8_4_;
  MStack_140._inner._func.a._4_4_ = uStack_1fc;
  MStack_140._inner._inner._next = auStack_1f8._0_4_;
  MStack_140._inner._inner._from = auStack_1f8._4_4_;
  local_148 = local_210._0_4_;
  uStack_144 = local_210._4_4_;
  MStack_140._0_4_ = auStack_208._0_4_;
  MStack_140._4_4_ = auStack_208._4_4_;
  if ((bool)local_1f0._0_1_ == false) {
    auStack_120._8_4_ = auStack_208._8_4_;
    auStack_120._12_4_ = uStack_1fc;
    auStack_120._16_4_ = auStack_1f8._0_4_;
    auStack_120._20_4_ = auStack_1f8._4_4_;
    MStack_140._inner._inner._to = local_210._0_4_;
    MStack_140._inner._20_4_ = local_210._4_4_;
    auStack_120._0_4_ = auStack_208._0_4_;
    auStack_120._4_4_ = auStack_208._4_4_;
  }
  else {
    if ((unaff_R15 != (Value)0x0) && (*(int *)((long)unaff_R15 + 8) == 0)) {
      (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
    }
    if (VStack_1e8 != (Value)0x0) {
      pIVar1 = (Inference *)((long)VStack_1e8 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)VStack_1e8 + 8))();
      }
    }
    auStack_120._8_4_ = (uint)MStack_140._inner._func.a;
    auStack_120._12_4_ = MStack_140._inner._func.a._4_4_;
    auStack_120._16_4_ = MStack_140._inner._inner._next;
    auStack_120._20_4_ = MStack_140._inner._inner._from;
    MStack_140._inner._inner._to = local_148;
    MStack_140._inner._20_4_ = uStack_144;
    auStack_120._0_4_ = MStack_140._0_4_;
    auStack_120._4_4_ = MStack_140._4_4_;
    if (unaff_R15 != (Value)0x0 && (bool)uVar3 == true) {
      *(int *)((long)unaff_R15 + 8) = *(int *)((long)unaff_R15 + 8) + 1;
    }
  }
  bVar11 = unaff_R15 != (Value)0x0 & uVar3;
  local_148 = MStack_140._inner._inner._to;
  uStack_144 = MStack_140._inner._20_4_;
  MStack_140._0_4_ = auStack_120._0_4_;
  MStack_140._4_4_ = auStack_120._4_4_;
  MStack_140._inner._func.a._0_4_ = auStack_120._8_4_;
  MStack_140._inner._func.a._4_4_ = auStack_120._12_4_;
  MStack_140._inner._inner._next = auStack_120._16_4_;
  MStack_140._inner._inner._from = auStack_120._20_4_;
  if (bVar11 == 1) {
    pIVar1 = (Inference *)((long)unaff_R15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + 1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
    }
  }
  if (bVar11 != 0) {
    *(int *)((long)unaff_R15 + 8) = *(int *)((long)unaff_R15 + 8) + 1;
  }
  auStack_208._4_4_ = MStack_140._inner._20_4_;
  auStack_208._0_4_ = MStack_140._inner._inner._to;
  unique0x10000bac = (Clause *)CONCAT44(auStack_120._4_4_,auStack_120._0_4_);
  auStack_1f8._4_4_ = auStack_120._12_4_;
  auStack_1f8._0_4_ = auStack_120._8_4_;
  local_1f0._4_4_ = auStack_120._20_4_;
  local_1f0._0_4_ = auStack_120._16_4_;
  VStack_1e8._0_1_ = uVar3;
  if (((bool)uVar3 != false) && (VStack_1e0 = unaff_R15, unaff_R15 != (Value)0x0)) {
    *(int *)((long)unaff_R15 + 8) = *(int *)((long)unaff_R15 + 8) + 1;
  }
  local_210 = (undefined1  [8])premise;
  bVar9 = ::Lib::
          MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
          ::hasNext((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_210);
  if (bVar9) {
    ::Lib::
    MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            *)&local_1a8.init);
    premise = (Clause *)local_1a8;
    if (local_1a8 != (Value)0x0) {
      *(int *)((long)local_1a8 + 8) = *(int *)((long)local_1a8 + 8) + 1;
    }
    local_1d8 = CONCAT71(local_1d8._1_7_,1);
    if (local_1a8 == (Value)0x0) {
      VStack_1d0 = local_1a8;
    }
    else {
      iVar2 = *(int *)((long)local_1a8 + 8);
      *(int *)((long)local_1a8 + 8) = iVar2 + 1;
      VStack_1d0 = local_1a8;
      *(int *)((long)local_1a8 + 8) = iVar2 + 2;
      pIVar1 = (Inference *)((long)local_1a8 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)local_1a8 + 8))(local_1a8);
      }
    }
  }
  else {
    local_1d8 = 0;
    VStack_1d0 = (Value)0x0;
  }
  if (bVar9) {
    if ((Value)premise != (Value)0x0) {
      pIVar1 = (Inference *)((long)premise + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)premise + 8))(premise);
      }
    }
    if (local_1a8 != (Value)0x0) {
      pIVar1 = (Inference *)((long)local_1a8 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)local_1a8 + 8))();
      }
    }
  }
  if (bVar11 != 0) {
    pIVar1 = (Inference *)((long)unaff_R15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
    }
  }
  stack0xfffffffffffffef8 = auStack_208._0_8_;
  uVar8 = stack0xfffffffffffffef8;
  uStack_100 = stack0xfffffffffffffe00;
  pCVar5 = uStack_100;
  local_f8._0_8_ = auStack_1f8;
  local_f8._elem._elem = local_1f0;
  uVar4 = VStack_1e8._0_1_;
  if (((bool)VStack_1e8._0_1_ == true) && (premise = (Clause *)VStack_1e0, VStack_1e0 != (Value)0x0)
     ) {
    *(int *)((long)VStack_1e0 + 8) = *(int *)((long)VStack_1e0 + 8) + 1;
  }
  auStack_120._24_4_ = (undefined4)auStack_208._0_8_;
  uStack_104 = SUB84(auStack_208._0_8_,4);
  uStack_100._0_4_ = (uint)stack0xfffffffffffffe00;
  uStack_100._4_4_ = (undefined4)((ulong)stack0xfffffffffffffe00 >> 0x20);
  unique0x10000f7e = uVar8;
  uStack_100 = pCVar5;
  if ((byte)local_1d8 == 1) {
    if (VStack_1d0 != (Value)0x0) {
      *(int *)((long)VStack_1d0 + 8) = *(int *)((long)VStack_1d0 + 8) + 1;
    }
    local_1a0 = (Clause *)local_210;
    local_198 = auStack_120._24_4_;
    uStack_194 = uStack_104;
    uStack_190 = (uint)uStack_100;
    uStack_18c = uStack_100._4_4_;
    local_188._0_8_ = auStack_1f8;
    local_188._elem._elem = local_1f0;
    local_178 = VStack_1e8._0_1_;
    if (((bool)VStack_1e8._0_1_ != false) &&
       (local_170 = (Value)premise, (Value)premise != (Value)0x0)) {
      *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
    }
    local_168 = (byte)local_1d8;
    local_160 = VStack_1d0;
    if ((VStack_1d0 != (Value)0x0) && (*(int *)((long)VStack_1d0 + 8) == 0)) {
      (**(code **)(*(long *)VStack_1d0 + 8))();
    }
  }
  else {
    local_1a0 = (Clause *)local_210;
    local_198 = auStack_120._24_4_;
    uStack_194 = uStack_104;
    uStack_190 = (uint)uStack_100;
    uStack_18c = uStack_100._4_4_;
    local_188._0_8_ = auStack_1f8;
    local_188._elem._elem = local_1f0;
    local_178 = VStack_1e8._0_1_;
    if (((bool)VStack_1e8._0_1_ != false) &&
       (local_170 = (Value)premise, (Value)premise != (Value)0x0)) {
      *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
    }
    local_168 = (byte)local_1d8;
  }
  if ((Value)premise != (Value)0x0 && (bool)uVar4 == true) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if (((byte)local_1d8 == '\x01') && (VStack_1d0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)VStack_1d0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VStack_1d0 + 8))();
    }
  }
  if (((bool)VStack_1e8._0_1_ == true) && (VStack_1e0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)VStack_1e0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VStack_1e0 + 8))();
    }
  }
  if (bVar11 != 0) {
    pIVar1 = (Inference *)((long)unaff_R15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
    }
    if (bVar11 != 0) {
      pIVar1 = (Inference *)((long)unaff_R15 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
      }
    }
  }
  bVar6 = local_168;
  bVar11 = local_178;
  pCVar5 = local_1a0;
  if ((local_178 == 1) && (premise = (Clause *)local_170, local_170 != (Value)0x0)) {
    *(int *)((long)local_170 + 8) = *(int *)((long)local_170 + 8) + 1;
  }
  VVar15 = (Value)this;
  if ((local_168 == 1) && (VVar15 = local_160, local_160 != (Value)0x0)) {
    *(int *)((long)local_160 + 8) = *(int *)((long)local_160 + 8) + 1;
  }
  bVar13 = local_178 ^ 1;
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  bVar17 = local_168 ^ 1;
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
  }
  bVar12 = (Value)premise != (Value)0x0 & local_178;
  if (bVar12 == 1) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  local_158 = this;
  if ((VVar15 != (Value)0x0 && bVar17 == 0) && (*(int *)((long)VVar15 + 8) == 0)) {
    (**(code **)(*(long *)VVar15 + 8))(VVar15);
  }
  if (bVar12 != 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
  }
  local_e0 = pCVar5;
  local_d8 = local_198;
  uStack_d4 = uStack_194;
  uStack_d0 = uStack_190;
  uStack_cc = uStack_18c;
  local_c8 = local_188._0_4_;
  uStack_c4 = local_188._4_4_;
  uStack_c0 = local_188._elem._elem._0_4_;
  uStack_bc = local_188._elem._elem._4_4_;
  local_b8 = bVar11;
  if ((bVar11 != 0) && (local_b0 = (Value)premise, (Value)premise != (Value)0x0)) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  local_a8 = bVar6;
  if (bVar6 != 0) {
    if (VVar15 != (Value)0x0) {
      *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
    }
    local_a0 = VVar15;
    if (VVar15 != (Value)0x0 && bVar17 == 0) {
      pIVar1 = (Inference *)((long)VVar15 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)VVar15 + 8))(VVar15);
      }
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    pIVar1 = (Inference *)((long)VVar15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar15 + 8))(VVar15);
    }
  }
  if (bVar12 != 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    pIVar1 = (Inference *)((long)VVar15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar15 + 8))(VVar15);
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if ((bVar11 != 0) && (premise = (Clause *)local_b0, local_b0 != (Value)0x0)) {
    *(int *)((long)local_b0 + 8) = *(int *)((long)local_b0 + 8) + 1;
  }
  if ((bVar6 != 0) && (VVar15 = local_a0, local_a0 != (Value)0x0)) {
    *(int *)((long)local_a0 + 8) = *(int *)((long)local_a0 + 8) + 1;
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
  }
  bVar12 = (Value)premise != (Value)0x0 & bVar11;
  if (bVar12 == 1) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  bVar16 = VVar15 != (Value)0x0 & bVar6;
  if ((bVar16 == 1) && (*(int *)((long)VVar15 + 8) == 0)) {
    (**(code **)(*(long *)VVar15 + 8))(VVar15);
  }
  if (bVar12 != 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
  }
  local_88 = pCVar5;
  local_80 = local_198;
  uStack_7c = uStack_194;
  uStack_78 = uStack_190;
  uStack_74 = uStack_18c;
  local_70 = local_188._0_4_;
  uStack_6c = local_188._4_4_;
  uStack_68 = local_188._elem._elem._0_4_;
  uStack_64 = local_188._elem._elem._4_4_;
  local_60 = bVar11;
  if ((bVar11 != 0) && (local_58 = (Value)premise, (Value)premise != (Value)0x0)) {
    *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
  }
  local_50 = bVar6;
  if (bVar6 == 0) {
    local_40 = 0;
  }
  else {
    if (VVar15 != (Value)0x0) {
      *(int *)((long)VVar15 + 8) = *(int *)((long)VVar15 + 8) + 1;
    }
    local_40 = 0;
    local_48 = VVar15;
    if (VVar15 != (Value)0x0 && bVar17 == 0) {
      pIVar1 = (Inference *)((long)VVar15 + 8);
      *(int *)pIVar1 = *(int *)pIVar1 + -1;
      if (*(int *)pIVar1 == 0) {
        (**(code **)(*(long *)VVar15 + 8))(VVar15);
      }
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if (bVar16 != 0) {
    pIVar1 = (Inference *)((long)VVar15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar15 + 8))(VVar15);
    }
  }
  if (bVar12 != 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  if (VVar15 != (Value)0x0 && bVar17 == 0) {
    pIVar1 = (Inference *)((long)VVar15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VVar15 + 8))(VVar15);
    }
  }
  if ((Value)premise != (Value)0x0 && bVar13 == 0) {
    pIVar1 = (Inference *)((long)premise + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)premise + 8))(premise);
    }
  }
  pp_Var10 = (_func_int **)::operator_new(0x78,8);
  pFVar7 = local_158;
  stack0xfffffffffffffe00 = pCVar5;
  auStack_1f8._4_4_ = uStack_194;
  auStack_1f8._0_4_ = local_198;
  local_1f0._4_4_ = uStack_18c;
  local_1f0._0_4_ = uStack_190;
  VStack_1e8 = (Value)local_188._0_8_;
  VStack_1e0 = local_188._elem._elem;
  local_1d8 = CONCAT71(local_1d8._1_7_,bVar11);
  if ((bVar11 != 0) && (VStack_1d0 = local_58, local_58 != (Value)0x0)) {
    *(int *)((long)local_58 + 8) = *(int *)((long)local_58 + 8) + 1;
  }
  local_1c8 = bVar6;
  if ((bVar6 != 0) && (local_1c0 = local_48, local_48 != (Value)0x0)) {
    *(int *)((long)local_48 + 8) = *(int *)((long)local_48 + 8) + 1;
  }
  local_1b8 = 0;
  *(undefined4 *)(pp_Var10 + 1) = 0;
  *pp_Var10 = (_func_int *)&PTR__ProxyIterator_00b64bb8;
  pp_Var10[3] = in_RDX;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(pp_Var10 + 4),
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(local_210 + 0x10));
  *(undefined1 *)(pp_Var10 + 0xd) = 0;
  *(int *)(pp_Var10 + 1) = *(int *)(pp_Var10 + 1) + 1;
  (pFVar7->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
  super_InferenceEngine._vptr_InferenceEngine = pp_Var10;
  if ((local_1c8 == 1) && (local_1c0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_1c0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_1c0 + 8))();
    }
  }
  if (((byte)local_1d8 == '\x01') && (VStack_1d0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)VStack_1d0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)VStack_1d0 + 8))();
    }
  }
  if ((local_50 == 1) && (local_48 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_48 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if ((local_60 == 1) && (local_58 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_58 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if ((local_a8 == 1) && (local_a0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_a0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if ((local_b8 == 1) && (local_b0 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_b0 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if ((local_168 == 1) && (local_160 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_160 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_160 + 8))();
    }
  }
  if ((local_178 == 1) && (local_170 != (Value)0x0)) {
    pIVar1 = (Inference *)((long)local_170 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  if (unaff_R15 != (Value)0x0 && (bool)uVar3 == true) {
    pIVar1 = (Inference *)((long)unaff_R15 + 8);
    *(int *)pIVar1 = *(int *)pIVar1 + -1;
    if (*(int *)pIVar1 == 0) {
      (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)pFVar7;
}

Assistant:

Kernel::ClauseIterator FunctionDefinitionRewriting::generateClauses(Clause *premise)
{
  return pvi(premise->iterLits()
    .flatMap([](Literal *lit) {
      NonVariableNonTypeIterator nvi(lit);
      return pvi(pushPairIntoRightIterator(lit, getUniquePersistentIteratorFromPtr(&nvi)));
    })
    .flatMap([this](std::pair<Literal*, Term*> arg){
      return pvi(pushPairIntoRightIterator(arg,
        GeneratingInferenceEngine::_salg->getFunctionDefinitionHandler().getGeneralizations(arg.second)));
    })
    .map([premise](auto arg) {
      auto &qr = arg.second;
      bool temp;
      return (Clause*)performRewriting(premise, arg.first.first, TermList(arg.first.second), qr.data->clause,
        qr.data->literal, qr.data->term, qr.unifier, nullptr, temp,
        Inference(GeneratingInference2(InferenceRule::FUNCTION_DEFINITION_REWRITING, premise, qr.data->clause)));
    })
    .filter(NonzeroFn()));
}